

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O3

JSONNode __thiscall ser::FieldsTable::TableToJSON(FieldsTable *this)

{
  size_t *psVar1;
  internalJSONNode *piVar2;
  _Rb_tree_node_base *p_Var3;
  long in_RSI;
  undefined1 local_48 [32];
  
  piVar2 = internalJSONNode::newInternal('\x04');
  *(internalJSONNode **)&(this->data_)._M_t._M_impl = piVar2;
  local_48._0_8_ = (internalJSONNode *)(local_48 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"FieldsTable","");
  if (1 < piVar2->refcount) {
    piVar2->refcount = piVar2->refcount - 1;
    piVar2 = internalJSONNode::newInternal(piVar2);
  }
  *(internalJSONNode **)&(this->data_)._M_t._M_impl = piVar2;
  std::__cxx11::string::_M_assign((string *)&piVar2->_name);
  piVar2->_name_encoded = true;
  if ((internalJSONNode *)local_48._0_8_ != (internalJSONNode *)(local_48 + 0x10)) {
    operator_delete((void *)local_48._0_8_);
  }
  for (p_Var3 = *(_Rb_tree_node_base **)(in_RSI + 0x18);
      p_Var3 != (_Rb_tree_node_base *)(in_RSI + 8);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    DataFieldInfo::ToJSON((DataFieldInfo *)local_48,(int)p_Var3 + 0x40);
    piVar2 = *(internalJSONNode **)&(this->data_)._M_t._M_impl;
    if (1 < piVar2->refcount) {
      piVar2->refcount = piVar2->refcount - 1;
      piVar2 = internalJSONNode::newInternal(piVar2);
    }
    *(internalJSONNode **)&(this->data_)._M_t._M_impl = piVar2;
    internalJSONNode::push_back(piVar2,(JSONNode *)local_48);
    if ((internalJSONNode *)local_48._0_8_ != (internalJSONNode *)0x0) {
      psVar1 = (size_t *)(local_48._0_8_ + 0x60);
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) {
        internalJSONNode::deleteInternal((internalJSONNode *)local_48._0_8_);
      }
    }
  }
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode FieldsTable::TableToJSON() const
{
    int id = 0;
    JSONNode node(JSON_ARRAY);
    node.set_name("FieldsTable");
    for (std::map<std::string, DataFieldInfo>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        node.push_back(iter->second.ToJSON(id++));
    }
    return node;
}